

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::web_seed_t::web_seed_t
          (web_seed_t *this,string *url_,string *auth_,headers_t *extra_headers_)

{
  time_point32 tVar1;
  peer_source_flags_t local_ad;
  basic_endpoint<boost::asio::ip::tcp> local_ac;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  string local_68;
  string local_48;
  headers_t *local_28;
  headers_t *extra_headers__local;
  string *auth__local;
  string *url__local;
  web_seed_t *this_local;
  
  local_28 = extra_headers_;
  extra_headers__local = (headers_t *)auth_;
  auth__local = url_;
  url__local = (string *)this;
  ::std::__cxx11::string::string((string *)&local_48,(string *)url_);
  ::std::__cxx11::string::string((string *)&local_68,(string *)extra_headers__local);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_90,local_28);
  web_seed_entry::web_seed_entry(&this->super_web_seed_entry,&local_48,&local_68,&local_90);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_90);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  tVar1 = time_now32();
  *(duration *)&(this->super_web_seed_entry).field_0x5c = tVar1.__d.__r;
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  ::vector(&this->endpoints);
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint(&local_ac);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::peer_source_flags_tag,_void>::
  bitfield_flag(&local_ad);
  ipv4_peer::ipv4_peer(&this->peer_info,&local_ac,true,local_ad);
  this->supports_keepalive = true;
  this->resolving = false;
  this->removed = false;
  this->interesting = true;
  this->ephemeral = false;
  this->no_local_ips = false;
  this->disabled = false;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
            (&(this->restart_request).piece,-1);
  (this->restart_request).start = -1;
  (this->restart_request).length = -1;
  container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>::container_wrapper
            (&this->restart_piece);
  ::std::
  map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->redirects);
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
  typed_bitfield(&this->have_files);
  *(uint *)&(this->peer_info).super_torrent_peer.field_0x1b =
       *(uint *)&(this->peer_info).super_torrent_peer.field_0x1b & 0x7fffffff | 0x80000000;
  return;
}

Assistant:

web_seed_t::web_seed_t(std::string const& url_
		, std::string const& auth_
		, web_seed_entry::headers_t const& extra_headers_)
		: web_seed_entry(url_, auth_, extra_headers_)
	{
		peer_info.web_seed = true;
	}